

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_ToInt64SatFree(JSContext *ctx,int64_t *pres,JSValue val)

{
  double dVar1;
  int iVar2;
  uint in_ECX;
  undefined8 in_RDX;
  long *in_RSI;
  JSValue JVar3;
  double d;
  uint32_t tag;
  undefined1 in_stack_ffffffffffffffa8 [12];
  int local_18;
  undefined4 uStack_14;
  uint local_10;
  
  local_18 = (int)in_RDX;
  uStack_14 = (undefined4)((ulong)in_RDX >> 0x20);
  local_10 = in_ECX;
  do {
    if (local_10 < 4) {
      *in_RSI = (long)local_18;
      return 0;
    }
    if (local_10 == 6) {
      *in_RSI = 0;
      return -1;
    }
    if (local_10 == 7) {
      dVar1 = (double)CONCAT44(uStack_14,local_18);
      if (NAN(dVar1)) {
        *in_RSI = 0;
      }
      else if (-9.223372036854776e+18 <= dVar1) {
        if (dVar1 <= 9.223372036854776e+18) {
          *in_RSI = (long)dVar1;
        }
        else {
          *in_RSI = 0x7fffffffffffffff;
        }
      }
      else {
        *in_RSI = -0x8000000000000000;
      }
      return 0;
    }
    JVar3.tag._4_4_ = local_10;
    JVar3._0_12_ = in_stack_ffffffffffffffa8;
    JVar3 = JS_ToNumberFree((JSContext *)0x132eb5,JVar3);
    local_18 = JVar3.u._0_4_;
    uStack_14 = JVar3.u._4_4_;
    local_10 = (uint)JVar3.tag;
    iVar2 = JS_IsException(JVar3);
  } while (iVar2 == 0);
  *in_RSI = 0;
  return -1;
}

Assistant:

static int JS_ToInt64SatFree(JSContext *ctx, int64_t *pres, JSValue val)
{
    uint32_t tag;

 redo:
    tag = JS_VALUE_GET_NORM_TAG(val);
    switch(tag) {
    case JS_TAG_INT:
    case JS_TAG_BOOL:
    case JS_TAG_NULL:
    case JS_TAG_UNDEFINED:
        *pres = JS_VALUE_GET_INT(val);
        return 0;
    case JS_TAG_EXCEPTION:
        *pres = 0;
        return -1;
    case JS_TAG_FLOAT64:
        {
            double d = JS_VALUE_GET_FLOAT64(val);
            if (isnan(d)) {
                *pres = 0;
            } else {
                if (d < INT64_MIN)
                    *pres = INT64_MIN;
                else if (d > INT64_MAX)
                    *pres = INT64_MAX;
                else
                    *pres = (int64_t)d;
            }
        }
        return 0;
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_FLOAT:
        {
            JSBigFloat *p = JS_VALUE_GET_PTR(val);
            bf_get_int64(pres, &p->num, 0);
            JS_FreeValue(ctx, val);
        }
        return 0;
#endif
    default:
        val = JS_ToNumberFree(ctx, val);
        if (JS_IsException(val)) {
            *pres = 0;
            return -1;
        }
        goto redo;
    }
}